

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

void uECC_decompress(uint8_t *compressed,uint8_t *public_key,uECC_Curve curve)

{
  uECC_word_t *puVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  uECC_word_t point [8];
  uECC_word_t auStack_68 [8];
  
  puVar1 = auStack_68 + curve->num_words;
  uECC_vli_bytesToNative(auStack_68,compressed + 1,(int)curve->num_bytes);
  (*curve->x_side)(puVar1,auStack_68,curve);
  (*curve->mod_sqrt)(puVar1,curve);
  if ((((uint)*puVar1 & 1) != (*compressed & 1)) && (cVar3 = curve->num_words, 0 < (long)cVar3)) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar8 = puVar1[lVar5] + uVar6;
      if (uVar8 != 0) {
        uVar6 = (ulong)(curve->p[lVar5] < uVar8);
      }
      puVar1[lVar5] = curve->p[lVar5] - uVar8;
      lVar5 = lVar5 + 1;
    } while (cVar3 != lVar5);
  }
  uVar4 = (uint)curve->num_bytes;
  if ('\0' < curve->num_bytes) {
    uVar6 = (ulong)uVar4;
    iVar2 = uVar4 * 8;
    uVar8 = 0;
    do {
      iVar2 = iVar2 + -8;
      uVar4 = uVar4 - 1;
      public_key[uVar8] =
           (uint8_t)(*(ulong *)((long)auStack_68 + (ulong)(uVar4 & 0xfffffff8)) >>
                    ((byte)iVar2 & 0x38));
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar6);
  }
  cVar3 = curve->num_bytes;
  if (0 < (long)cVar3) {
    uVar4 = (uint)cVar3;
    uVar6 = (ulong)uVar4;
    bVar7 = cVar3 * '\b';
    uVar8 = 0;
    do {
      uVar4 = uVar4 - 1;
      bVar7 = bVar7 - 8;
      public_key[uVar8 + (long)cVar3] =
           (uint8_t)(*(ulong *)((long)puVar1 + (ulong)(uVar4 & 0xfffffff8)) >> (bVar7 & 0x38));
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar6);
  }
  return;
}

Assistant:

void uECC_decompress(const uint8_t *compressed, uint8_t *public_key, uECC_Curve curve) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *point = (uECC_word_t *)public_key;
#else
    uECC_word_t point[uECC_MAX_WORDS * 2];
#endif
    uECC_word_t *y = point + curve->num_words;
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy(public_key, compressed+1, curve->num_bytes);
#else
    uECC_vli_bytesToNative(point, compressed + 1, curve->num_bytes);
#endif
    curve->x_side(y, point, curve);
    curve->mod_sqrt(y, curve);

    if ((y[0] & 0x01) != (compressed[0] & 0x01)) {
        uECC_vli_sub(y, curve->p, y, curve->num_words);
    }

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_nativeToBytes(public_key, curve->num_bytes, point);
    uECC_vli_nativeToBytes(public_key + curve->num_bytes, curve->num_bytes, y);
#endif
}